

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofConstraint.cpp
# Opt level: O0

void __thiscall
btGeneric6DofConstraint::getInfo1NonVirtual(btGeneric6DofConstraint *this,btConstraintInfo1 *info)

{
  btConstraintInfo1 *info_local;
  btGeneric6DofConstraint *this_local;
  
  if ((this->m_useSolveConstraintObsolete & 1U) == 0) {
    info->m_numConstraintRows = 6;
    info->nub = 0;
  }
  else {
    info->m_numConstraintRows = 0;
    info->nub = 0;
  }
  return;
}

Assistant:

void btGeneric6DofConstraint::getInfo1NonVirtual (btConstraintInfo1* info)
{
	if (m_useSolveConstraintObsolete)
	{
		info->m_numConstraintRows = 0;
		info->nub = 0;
	} else
	{
		//pre-allocate all 6
		info->m_numConstraintRows = 6;
		info->nub = 0;
	}
}